

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O3

QPDFObjectHandle __thiscall
QPDFPageObjectHelper::getMediaBox(QPDFPageObjectHelper *this,bool copy_if_shared)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined7 in_register_00000031;
  QPDFObjectHandle QVar2;
  long *local_48 [2];
  long local_38 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"/MediaBox","");
  QVar2 = getAttribute(this,(string *)CONCAT71(in_register_00000031,copy_if_shared),
                       SUB81(local_48,0));
  _Var1._M_pi = QVar2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
    _Var1._M_pi = extraout_RDX;
  }
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageObjectHelper::getMediaBox(bool copy_if_shared)
{
    return getAttribute("/MediaBox", copy_if_shared);
}